

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O3

void Fra_ClausPrintIndClauses(Clu_Man_t *p)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int Counters [9];
  int local_38 [10];
  
  local_38[4] = 0;
  local_38[5] = 0;
  local_38[6] = 0;
  local_38[7] = 0;
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_38[8] = 0;
  lVar4 = (long)p->vClausesProven->nSize;
  if (0 < lVar4) {
    piVar2 = p->vClausesProven->pArray;
    lVar3 = 0;
    iVar5 = 0;
    do {
      iVar1 = piVar2[lVar3];
      iVar5 = iVar1 - iVar5;
      if (iVar5 < 8) {
        local_38[iVar5] = local_38[iVar5] + 1;
      }
      else {
        local_38[8] = local_38[8] + 1;
      }
      lVar3 = lVar3 + 1;
      iVar5 = iVar1;
    } while (lVar4 != lVar3);
  }
  printf("SUMMARY: Total proved clauses = %d. ");
  printf("Clause per lit: ");
  uVar6 = 0;
  do {
    if (local_38[uVar6] != 0) {
      printf("%d=%d ",uVar6 & 0xffffffff);
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 8);
  if (local_38[8] != 0) {
    printf(">7=%d ");
  }
  putchar(10);
  return;
}

Assistant:

void Fra_ClausPrintIndClauses( Clu_Man_t * p )
{
    int Counters[9] = {0};
    int * pStart; 
    int Beg, End, i;
    Beg = 0;
    pStart = Vec_IntArray( p->vLitsProven );
    Vec_IntForEachEntry( p->vClausesProven, End, i )
    {
        if ( End - Beg >= 8 )
            Counters[8]++;
        else
            Counters[End - Beg]++;
//printf( "%d ", End-Beg );
        Beg = End;
    }
    printf( "SUMMARY: Total proved clauses = %d. ", Vec_IntSize(p->vClausesProven) );
    printf( "Clause per lit: " );
    for ( i = 0; i < 8; i++ )
        if ( Counters[i] )
            printf( "%d=%d ", i, Counters[i] );
    if ( Counters[8] )
            printf( ">7=%d ", Counters[8] );
    printf( "\n" );
}